

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch2v3Approvals.h
# Opt level: O0

void __thiscall
Catch2ApprovalListener::testCaseStarting(Catch2ApprovalListener *this,TestCaseInfo *testInfo)

{
  anon_class_1_0_00000001 *__f;
  long in_RSI;
  long in_RDI;
  function<void_()> *this_00;
  string *file;
  TestName *in_stack_ffffffffffffff90;
  TestPassedNotification *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  undefined1 local_31 [49];
  
  __f = (anon_class_1_0_00000001 *)(in_RDI + 0x18);
  this_00 = *(function<void_()> **)(in_RSI + 0x68);
  file = (string *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (allocator<char> *)in_stack_ffffffffffffffa0);
  ApprovalTests::TestName::setFileName(in_stack_ffffffffffffff90,file);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  ApprovalTests::FrameworkIntegrations::setCurrentTest((TestName *)0x11a0d6);
  std::function<void()>::
  function<Catch2ApprovalListener::testCaseStarting(Catch::TestCaseInfo_const&)::_lambda()_1_,void>
            (this_00,__f);
  ApprovalTests::FrameworkIntegrations::setTestPassedNotification(in_stack_ffffffffffffffa0);
  std::function<void_()>::~function((function<void_()> *)0x11a0fe);
  return;
}

Assistant:

virtual void testCaseStarting(Catch::TestCaseInfo const& testInfo) override
    {

        currentTest.setFileName(testInfo.lineInfo.file);
        ApprovalTests::FrameworkIntegrations::setCurrentTest(&currentTest);
        ApprovalTests::FrameworkIntegrations::setTestPassedNotification(
            []() { REQUIRE(true); });
    }